

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  char *__s2;
  long lVar1;
  int iVar2;
  char *__ptr;
  char *pcVar3;
  void *__ptr_00;
  size_t sVar4;
  char cVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  wchar_t wVar9;
  size_t __size;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  size_t buff_size;
  void *local_60;
  size_t local_38;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __ptr = slurpfile(&local_38,"%s");
  if (__ptr == (char *)0x0) {
    failure_start(pathname,line,"Can\'t read file: %s",pathname);
LAB_001067fd:
    wVar9 = L'\0';
    failure_finish(pathname);
  }
  else {
    lVar7 = -1;
    lVar8 = 8;
    do {
      lVar8 = lVar8 + -8;
      lVar1 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (lines[lVar1] != (char *)0x0);
    if (lVar7 == 0) {
      local_60 = (void *)0x0;
    }
    else {
      local_60 = malloc(-lVar8);
      if (local_60 == (void *)0x0) {
        failure_start(pathname,line,"Can\'t allocate memory");
        goto LAB_001067fd;
      }
      pcVar3 = *lines;
      if (pcVar3 != (char *)0x0) {
        lVar8 = 0;
        do {
          pcVar3 = strdup(pcVar3);
          *(char **)((long)local_60 + lVar8) = pcVar3;
          pcVar3 = *(char **)((long)lines + lVar8 + 8);
          lVar8 = lVar8 + 8;
        } while (pcVar3 != (char *)0x0);
      }
    }
    if ((long)local_38 < 1) {
      __size = 0;
      bVar10 = true;
      __ptr_00 = (void *)0x0;
    }
    else {
      __size = 0;
      pcVar3 = __ptr;
      cVar5 = '\0';
      do {
        cVar6 = *pcVar3;
        if ((cVar6 == '\r') || (cVar6 == '\n')) {
          *pcVar3 = '\0';
          cVar6 = '\0';
        }
        __size = __size + (cVar6 != '\0' && cVar5 == '\0');
        pcVar3 = pcVar3 + 1;
        cVar5 = cVar6;
      } while (pcVar3 < __ptr + local_38);
      bVar10 = __size == 0;
      if (bVar10) {
        __size = 0;
        bVar10 = true;
        __ptr_00 = (void *)0x0;
      }
      else {
        __ptr_00 = calloc(8,__size);
        if (__ptr_00 == (void *)0x0) {
          failure_start(pathname,line,"Can\'t allocate memory");
          failure_finish(pathname);
          free(local_60);
          return L'\0';
        }
        if ((long)local_38 < 1) {
          bVar10 = false;
        }
        else {
          lVar8 = 0;
          pcVar3 = __ptr;
          do {
            if (*pcVar3 != '\0') {
              *(char **)((long)__ptr_00 + lVar8 * 8) = pcVar3;
              lVar8 = lVar8 + 1;
            }
            sVar4 = strlen(pcVar3);
            pcVar3 = pcVar3 + sVar4 + 1;
          } while (pcVar3 < __ptr + local_38);
        }
      }
    }
    bVar11 = true;
    if (lVar7 != 0) {
      lVar8 = 0;
      do {
        pcVar3 = *(char **)((long)local_60 + lVar8 * 8);
        if (pcVar3 != (char *)0x0 && !bVar10) {
          sVar4 = 0;
          do {
            __s2 = *(char **)((long)__ptr_00 + sVar4 * 8);
            if ((__s2 != (char *)0x0) && (iVar2 = strcmp(pcVar3,__s2), iVar2 == 0)) {
              free(pcVar3);
              *(undefined8 *)((long)local_60 + lVar8 * 8) = 0;
              *(undefined8 *)((long)__ptr_00 + sVar4 * 8) = 0;
              break;
            }
            sVar4 = sVar4 + 1;
          } while (__size != sVar4);
        }
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      iVar2 = 0;
      lVar8 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(*(long *)((long)local_60 + lVar8 * 8) == 0);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      bVar11 = iVar2 == 0;
    }
    bVar12 = true;
    if (!bVar10) {
      iVar2 = 0;
      sVar4 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(*(long *)((long)__ptr_00 + sVar4 * 8) == 0);
        sVar4 = sVar4 + 1;
      } while (__size != sVar4);
      bVar12 = iVar2 == 0;
    }
    if ((bool)(bVar11 & bVar12)) {
      free(__ptr);
      free(local_60);
      free(__ptr_00);
      wVar9 = L'\x01';
    }
    else {
      failure_start(file,line,"File doesn\'t match: %s",pathname);
      if (lVar7 != 0) {
        lVar8 = 0;
        do {
          if (*(long *)((long)local_60 + lVar8 * 8) != 0) {
            logprintf("  Expected but not present: %s\n");
            file = *(char **)((long)local_60 + lVar8 * 8);
            free(file);
          }
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if (!bVar10) {
        sVar4 = 0;
        do {
          if (*(long *)((long)__ptr_00 + sVar4 * 8) != 0) {
            file = "  Present but not expected: %s\n";
            logprintf("  Present but not expected: %s\n");
          }
          sVar4 = sVar4 + 1;
        } while (__size != sVar4);
      }
      failure_finish(file);
      free(__ptr);
      free(local_60);
      free(__ptr_00);
      wVar9 = L'\0';
    }
  }
  return wVar9;
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = malloc(sizeof(char *) * expected_count);
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			return (0);
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(sizeof(char *), actual_count);
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			free(expected);
			return (0);
		}
		for (j = 0, p = buff; p < buff + buff_size; p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] == NULL)
			continue;
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(buff);
		free(expected);
		free(actual);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
	free(buff);
	free(expected);
	free(actual);
	return (0);
}